

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v5::internal::format_value<wchar_t,TestEnum2>
               (basic_buffer<wchar_t> *buffer,TestEnum2 *value)

{
  formatbuf<wchar_t> format_buf;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> output;
  ios_base local_128 [264];
  
  formatbuf<wchar_t>::formatbuf(&format_buf,buffer);
  std::wostream::wostream(&output,(wstreambuf *)&format_buf);
  std::wios::exceptions((int)&output + (int)*(undefined8 *)(_output + -0x18));
  std::wostream::operator<<(&output,*value);
  basic_buffer<wchar_t>::resize(buffer,buffer->size_);
  std::ios_base::~ios_base(local_128);
  std::wstreambuf::~wstreambuf((wstreambuf *)&format_buf);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}